

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_pcnt_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  bVar1 = *(byte *)((env->active_fpu).fpr + ws);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((env->active_fpu).fpr + wd) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 1);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 1) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 2);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 2) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 3);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 3) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 4);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 4) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 5);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 5) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 6);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 6) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 7);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 7) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 8);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 8) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 9);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 9) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 10);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 10) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xb) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xd) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf);
  uVar4 = (bVar1 >> 1 & 0xffffffd5) + (bVar1 & 0x55);
  uVar4 = (uVar4 >> 2 & 0xfffffff3) + (uVar4 & 0x33);
  *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xf) = (char)(uVar4 >> 4) + ((byte)uVar4 & 7);
  return;
}

Assistant:

void helper_msa_pcnt_b(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->b[0]  = msa_pcnt_df(DF_BYTE, pws->b[0]);
    pwd->b[1]  = msa_pcnt_df(DF_BYTE, pws->b[1]);
    pwd->b[2]  = msa_pcnt_df(DF_BYTE, pws->b[2]);
    pwd->b[3]  = msa_pcnt_df(DF_BYTE, pws->b[3]);
    pwd->b[4]  = msa_pcnt_df(DF_BYTE, pws->b[4]);
    pwd->b[5]  = msa_pcnt_df(DF_BYTE, pws->b[5]);
    pwd->b[6]  = msa_pcnt_df(DF_BYTE, pws->b[6]);
    pwd->b[7]  = msa_pcnt_df(DF_BYTE, pws->b[7]);
    pwd->b[8]  = msa_pcnt_df(DF_BYTE, pws->b[8]);
    pwd->b[9]  = msa_pcnt_df(DF_BYTE, pws->b[9]);
    pwd->b[10] = msa_pcnt_df(DF_BYTE, pws->b[10]);
    pwd->b[11] = msa_pcnt_df(DF_BYTE, pws->b[11]);
    pwd->b[12] = msa_pcnt_df(DF_BYTE, pws->b[12]);
    pwd->b[13] = msa_pcnt_df(DF_BYTE, pws->b[13]);
    pwd->b[14] = msa_pcnt_df(DF_BYTE, pws->b[14]);
    pwd->b[15] = msa_pcnt_df(DF_BYTE, pws->b[15]);
}